

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::save_load_online_state<dense_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,gd *g,stringstream *msg,
               dense_parameters *weights)

{
  float *data;
  byte bVar1;
  ulong uVar2;
  weight *pwVar3;
  uint32_t uVar4;
  size_t sVar5;
  float *pfVar6;
  ostream *poVar7;
  vw_exception *this;
  long lVar8;
  undefined7 in_register_00000011;
  size_t sVar9;
  uint uVar10;
  ulong *data_00;
  stringstream *psVar11;
  weight *pwVar12;
  uint32_t old_i;
  weight buff [4];
  undefined1 local_224 [4];
  ulong local_220;
  io_buf *local_218;
  uint local_20c;
  gd *local_208;
  vw *local_200;
  stringstream *local_1f8;
  stringstream *local_1f0;
  long local_1e8;
  long local_1e0;
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ostream local_1a8;
  
  uVar4 = all->num_bits;
  local_220 = 0;
  local_224 = (undefined1  [4])0x0;
  local_218 = model_file;
  local_208 = g;
  local_200 = all;
  if ((int)CONCAT71(in_register_00000011,read) == 0) {
    pwVar3 = weights->_begin;
    if (pwVar3 != pwVar3 + weights->_weight_mask + 1) {
      local_1e0 = 1L << ((byte)weights->_stride_shift & 0x3f);
      psVar11 = msg + 0x10;
      local_1e8 = local_1e0 * 4;
      lVar8 = 0;
      uVar10 = (uint)text;
      local_20c = (uint)text;
      pwVar12 = pwVar3;
      local_1f8 = psVar11;
      local_1f0 = msg;
      do {
        if ((*(float *)((long)pwVar3 + lVar8) != 0.0) || (NAN(*(float *)((long)pwVar3 + lVar8)))) {
          local_220 = (ulong)(lVar8 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
          std::ostream::_M_insert<unsigned_long>((ulong)psVar11);
          if (local_200->num_bits < 0x1f) {
            local_224 = (undefined1  [4])(uint)local_220;
            sVar5 = 4;
            data_00 = (ulong *)local_224;
          }
          else {
            sVar5 = 8;
            data_00 = &local_220;
          }
          bin_text_write_fixed(local_218,(char *)data_00,sVar5,msg,SUB41(uVar10,0));
          data = (float *)((long)pwVar3 + lVar8);
          if (local_208 == (gd *)0x0) {
LAB_0013d2f6:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar11,":",1);
            sVar5 = 4;
            pfVar6 = data;
          }
          else {
            if (local_208->adaptive == false) {
              if (local_208->normalized == false) goto LAB_0013d2f6;
            }
            else if (local_208->normalized != false) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar11,":",1);
              poVar7 = std::ostream::_M_insert<double>((double)*(float *)((long)pwVar3 + lVar8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::ostream::_M_insert<double>((double)*(float *)((long)pwVar3 + lVar8 + 4))
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              sVar5 = 0xc;
              pfVar6 = pwVar12 + 2;
              goto LAB_0013d312;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar11,":",1);
            poVar7 = std::ostream::_M_insert<double>((double)*data);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            sVar5 = 8;
            pfVar6 = pwVar12 + 1;
          }
LAB_0013d312:
          poVar7 = std::ostream::_M_insert<double>((double)*pfVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          msg = local_1f0;
          uVar10 = local_20c;
          bin_text_write_fixed(local_218,(char *)data,sVar5,local_1f0,SUB41(local_20c,0));
          psVar11 = local_1f8;
        }
        pwVar12 = pwVar12 + local_1e0;
        lVar8 = lVar8 + local_1e8;
      } while ((weight *)((long)pwVar3 + lVar8) != weights->_begin + weights->_weight_mask + 1);
    }
  }
  else {
    do {
      if (local_200->num_bits < 0x1f) {
        sVar5 = io_buf::bin_read_fixed(local_218,local_224,4,"");
        local_220 = (ulong)(uint)local_224;
      }
      else {
        sVar5 = io_buf::bin_read_fixed(local_218,(char *)&local_220,8,"");
      }
      if (sVar5 == 0) {
        return;
      }
      if ((ulong)(1L << ((byte)uVar4 & 0x3f)) <= local_220) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Model content is corrupted, weight vector index ",0x30);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," must be less than total vector length ",0x27);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                   ,0x314,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_1b8 = 0;
      uStack_1b0 = 0;
      sVar9 = 4;
      if (local_208 != (gd *)0x0) {
        if (local_208->adaptive == false) {
          if (local_208->normalized != false) goto LAB_0013d100;
        }
        else {
          sVar9 = 0xc;
          if (local_208->normalized == false) {
LAB_0013d100:
            sVar9 = 8;
          }
        }
      }
      sVar9 = io_buf::bin_read_fixed(local_218,(char *)&local_1b8,sVar9,"");
      bVar1 = (byte)weights->_stride_shift;
      uVar2 = weights->_weight_mask;
      pwVar3 = weights->_begin;
      lVar8 = 0;
      do {
        pwVar3[(local_220 << (bVar1 & 0x3f) & uVar2) + lVar8] =
             *(weight *)((long)&local_1b8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (1L << (bVar1 & 0x3f) != lVar8);
    } while (sVar5 + sVar9 != 0);
  }
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g, stringstream& msg, T& weights)
{
  uint64_t length = (uint64_t)1 << all.num_bits;

  uint64_t i = 0;
  uint32_t old_i = 0;
  size_t brw = 1;

  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight buff[4] = {0, 0, 0, 0};
        if (g == NULL || (!g->adaptive && !g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]), "");
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 2, "");
        else  // adaptive and normalized
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 3, "");
        uint32_t stride = 1 << weights.stride_shift();
        weight* v = &weights.strided_index(i);
        for (size_t i = 0; i < stride; i++) v[i] = buff[i];
      }
    } while (brw > 0);
  else  // write binary or text
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        msg << i;
        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        if (g == nullptr || (!g->adaptive && !g->normalized))
        {
          msg << ":" << *v << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
        }
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
        {
          // either adaptive or normalized
          msg << ":" << *v << " " << (&(*v))[1] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 2 * sizeof(*v), msg, text);
        }
        else
        {
          // adaptive and normalized
          msg << ":" << *v << " " << (&(*v))[1] << " " << (&(*v))[2] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 3 * sizeof(*v), msg, text);
        }
      }
}